

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::IsinfCase::compare(IsinfCase *this,void **inputs,void **outputs)

{
  reference pvVar1;
  ostream *poVar2;
  char *pcVar3;
  Float<unsigned_short,_5,_10,_15,_3U> local_54;
  byte local_52;
  byte local_51;
  float local_50;
  bool ref_1;
  int iStack_4c;
  bool out0_1;
  float in0_1;
  int compNdx_1;
  byte local_3e;
  byte local_3d;
  float local_3c;
  bool ref;
  int iStack_38;
  bool out0;
  float in0;
  int compNdx;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  IsinfCase *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar1 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar1->varType);
  pvVar1 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  compNdx = glu::VarType::getPrecision(&pvVar1->varType);
  in0 = (float)glu::getDataTypeScalarSize(scalarSize);
  if (compNdx == 2) {
    for (iStack_38 = 0; iStack_38 < (int)in0; iStack_38 = iStack_38 + 1) {
      local_3c = *(float *)((long)*outputs_local + (long)iStack_38 * 4);
      local_3d = *(int *)((long)*_precision + (long)iStack_38 * 4) != 0;
      tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                ((Float<unsigned_int,_8,_23,_127,_3U> *)&compNdx_1,local_3c);
      local_3e = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isInf
                           ((Float<unsigned_int,_8,_23,_127,_3U> *)&compNdx_1);
      if ((local_3d & 1) != local_3e) {
        poVar2 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_38);
        poVar2 = std::operator<<(poVar2,"] = ");
        HexBool::HexBool((HexBool *)&in0_1,(uint)(local_3e & 1));
        Functional::operator<<(poVar2,(HexBool *)&in0_1);
        return false;
      }
    }
  }
  else if (compNdx == 1) {
    for (iStack_4c = 0; iStack_4c < (int)in0; iStack_4c = iStack_4c + 1) {
      local_50 = *(float *)((long)*outputs_local + (long)iStack_4c * 4);
      local_51 = *(int *)((long)*_precision + (long)iStack_4c * 4) != 0;
      tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_54,local_50);
      local_52 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::isInf(&local_54);
      if ((!(bool)local_52) && ((local_51 & 1) != 0)) {
        poVar2 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_4c);
        poVar2 = std::operator<<(poVar2,"] = ");
        pcVar3 = "false";
        if ((local_52 & 1) != 0) {
          pcVar3 = "true";
        }
        std::operator<<(poVar2,pcVar3);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isInf();

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexBool(ref);
					return false;
				}
			}
		}
		else if (precision == glu::PRECISION_MEDIUMP)
		{
			// Inf support is optional, check that inputs that are not Inf in mediump don't result in true.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float16(in0).isInf();

				if (!ref && out0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}
		// else: no verification can be performed

		return true;
	}